

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O0

void google::base::SetLogger(LogSeverity severity,Logger *logger)

{
  LogDestination *this;
  lock_guard<std::mutex> local_20;
  lock_guard<std::mutex> l;
  Logger *logger_local;
  LogSeverity severity_local;
  
  l._M_device = (mutex_type *)logger;
  std::lock_guard<std::mutex>::lock_guard(&local_20,(mutex_type *)log_mutex);
  this = LogDestination::log_destination(severity);
  LogDestination::SetLoggerImpl(this,(Logger *)l._M_device);
  std::lock_guard<std::mutex>::~lock_guard(&local_20);
  return;
}

Assistant:

void base::SetLogger(LogSeverity severity, base::Logger* logger) {
  std::lock_guard<std::mutex> l{log_mutex};
  LogDestination::log_destination(severity)->SetLoggerImpl(logger);
}